

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

void __thiscall
crnlib::sparse_bit_array::clear_bit_range(sparse_bit_array *this,uint index,uint num)

{
  uint32 *puVar1;
  uint uVar2;
  uint uVar3;
  uint32 msk_1;
  uint group_bit_ofs_1;
  uint32 *pGroup_2;
  uint bits_to_set_1;
  uint group_index_2;
  uint32 *pGroup_1;
  uint group_index_1;
  uint32 msk;
  uint32 *pGroup;
  uint bits_to_set;
  uint max_bits_to_set;
  uint dword_bit_ofs;
  uint group_bit_ofs;
  uint group_index;
  uint num_local;
  uint index_local;
  sparse_bit_array *this_local;
  
  if (num != 0) {
    group_bit_ofs = num;
    group_index = index;
    if (num == 1) {
      clear_bit(this,index);
    }
    else {
      for (; (group_index & 0x1ff) != 0 || group_bit_ofs < 0x201; group_index = uVar2 + group_index)
      {
        uVar2 = math::minimum<unsigned_int>(0x20 - (group_index & 0x1f),group_bit_ofs);
        puVar1 = this->m_ppGroups[group_index >> 9];
        if (puVar1 != (uint32 *)0x0) {
          uVar3 = (group_index & 0x1ff) >> 5;
          puVar1[uVar3] =
               ((0xffffffffU >> (0x20U - (char)uVar2 & 0x1f)) << (sbyte)(group_index & 0x1f) ^
               0xffffffff) & puVar1[uVar3];
        }
        group_bit_ofs = group_bit_ofs - uVar2;
        if (group_bit_ofs == 0) {
          return;
        }
      }
      for (; 0x1ff < group_bit_ofs; group_bit_ofs = group_bit_ofs - 0x200) {
        if (this->m_ppGroups[group_index >> 9] != (uint32 *)0x0) {
          free_group(this->m_ppGroups[group_index >> 9]);
          this->m_ppGroups[group_index >> 9] = (uint32 *)0x0;
        }
        group_index = group_index + 0x200;
      }
      for (; group_bit_ofs != 0; group_bit_ofs = group_bit_ofs - uVar2) {
        uVar2 = math::minimum<unsigned_int>(0x20,group_bit_ofs);
        puVar1 = this->m_ppGroups[group_index >> 9];
        if (puVar1 != (uint32 *)0x0) {
          uVar3 = (group_index & 0x1ff) >> 5;
          puVar1[uVar3] =
               ((0xffffffffU >> (0x20U - (char)uVar2 & 0x1f)) <<
                ((byte)(group_index & 0x1ff) & 0x1f) ^ 0xffffffff) & puVar1[uVar3];
        }
        group_index = uVar2 + group_index;
      }
    }
  }
  return;
}

Assistant:

void sparse_bit_array::clear_bit_range(uint index, uint num)
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return;
        }
        else if (num == 1)
        {
            clear_bit(index);
            return;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            const uint group_bit_ofs = index & cBitsPerGroupMask;

            const uint dword_bit_ofs = group_bit_ofs & 31;
            const uint max_bits_to_set = 32 - dword_bit_ofs;

            const uint bits_to_set = math::minimum(max_bits_to_set, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));
                pGroup[group_bit_ofs >> 5] &= (~(msk << dword_bit_ofs));
            }

            num -= bits_to_set;
            if (!num)
            {
                return;
            }

            index += bits_to_set;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                free_group(pGroup);
                m_ppGroups[group_index] = nullptr;
            }

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint bits_to_set = math::minimum(32u, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                uint group_bit_ofs = index & cBitsPerGroupMask;

                uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

                pGroup[group_bit_ofs >> 5] &= (~(msk << (group_bit_ofs & 31)));
            }

            num -= bits_to_set;
            index += bits_to_set;
        }
    }